

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

string * __thiscall
t_lua_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_lua_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int *p_Var3;
  long lVar4;
  size_t __n;
  pointer pcVar5;
  t_type *ptVar6;
  _Rb_tree_node_base *p_Var7;
  int iVar8;
  t_const_value_type tVar9;
  uint uVar10;
  t_type *ptVar11;
  undefined4 extraout_var;
  ostream *poVar12;
  _Base_ptr p_Var13;
  int64_t iVar14;
  ostringstream *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_02;
  long *plVar15;
  size_type *psVar16;
  ulong uVar17;
  _func_int **pp_Var18;
  char *pcVar19;
  _Rb_tree_header *p_Var20;
  pointer pptVar21;
  bool bVar22;
  undefined1 auVar23 [12];
  ostringstream out;
  string local_228;
  t_lua_generator *local_208;
  t_type *local_200;
  string *local_1f8;
  string local_1f0;
  _Rb_tree_node_base *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  this_00 = (ostringstream *)local_1a8;
  local_1f8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(this_00);
  ptVar11 = t_type::get_true_type(type);
  iVar8 = (*(ptVar11->super_t_doc)._vptr_t_doc[5])(ptVar11);
  if ((char)iVar8 == '\0') {
    iVar8 = (*(ptVar11->super_t_doc)._vptr_t_doc[10])(ptVar11);
    if ((char)iVar8 == '\0') {
      iVar8 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xb])(ptVar11);
      local_208 = this;
      local_200 = ptVar11;
      if (((char)iVar8 == '\0') &&
         (iVar8 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xc])(ptVar11), (char)iVar8 == '\0')) {
        iVar8 = (*(ptVar11->super_t_doc)._vptr_t_doc[0x10])(ptVar11);
        pp_Var18 = (ptVar11->super_t_doc)._vptr_t_doc;
        if ((char)iVar8 == '\0') {
          iVar8 = (*pp_Var18[0xe])(ptVar11);
          if (((char)iVar8 != '\0') ||
             (iVar8 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xf])(ptVar11), (char)iVar8 != '\0')) {
            (*(ptVar11->super_t_doc)._vptr_t_doc[0xe])(ptVar11);
            ptVar6 = *(t_type **)&ptVar11[1].super_t_doc.has_doc_;
            iVar8 = (*(ptVar11->super_t_doc)._vptr_t_doc[3])(ptVar11);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_01,iVar8),
                                 ((undefined8 *)CONCAT44(extraout_var_01,iVar8))[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," = {",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            pptVar21 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar21 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              do {
                t_generator::indent((t_generator *)local_208,(ostream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
                render_const_value_abi_cxx11_(&local_228,local_208,ptVar6,*pptVar21);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                                     local_228._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p);
                }
                uVar10 = (*(local_200->super_t_doc)._vptr_t_doc[0xf])();
                pcVar19 = " = false";
                if ((char)uVar10 != '\0') {
                  pcVar19 = " = true";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar19,8 - (ulong)(uVar10 & 0xff));
                pptVar21 = pptVar21 + 1;
                if (pptVar21 !=
                    (value->listVal_).
                    super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                             ::endl_abi_cxx11_._M_string_length);
                }
              } while (pptVar21 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
          }
        }
        else {
          iVar8 = (*pp_Var18[3])(ptVar11);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_00,iVar8),
                               ((undefined8 *)CONCAT44(extraout_var_00,iVar8))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"{",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          ptVar6 = *(t_type **)&ptVar11[1].super_t_doc.has_doc_;
          ptVar11 = *(t_type **)&ptVar11[1].annotations_._M_t._M_impl;
          p_Var13 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var20 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          while ((_Rb_tree_header *)p_Var13 != p_Var20) {
            poVar12 = t_generator::indent((t_generator *)local_208,(ostream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"[",1);
            render_const_value_abi_cxx11_
                      (&local_228,local_208,ptVar6,*(t_const_value **)(p_Var13 + 1));
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_228._M_dataplus._M_p,local_228._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] = ",4);
            render_const_value_abi_cxx11_
                      (&local_1f0,local_208,ptVar11,(t_const_value *)p_Var13[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            if ((_Rb_tree_header *)p_Var13 != p_Var20) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
          }
          piVar1 = &(local_208->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar12 = t_generator::indent((t_generator *)local_208,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"}",1);
        }
      }
      else {
        iVar8 = (*(ptVar11->super_t_doc)._vptr_t_doc[3])(ptVar11);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var,iVar8),
                             ((undefined8 *)CONCAT44(extraout_var,iVar8))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," = {",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        p_Var13 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var20 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var13 != p_Var20) {
          paVar2 = &local_228.field_2;
          local_1d0 = &p_Var20->_M_header;
          while( true ) {
            pp_Var18 = local_200[1].super_t_doc._vptr_t_doc;
            if (pp_Var18 == (_func_int **)local_200[1].super_t_doc.doc_._M_dataplus._M_p) {
              ptVar11 = (t_type *)0x0;
            }
            else {
              ptVar11 = (t_type *)0x0;
              do {
                p_Var3 = *pp_Var18;
                lVar4 = *(long *)(*(long *)(p_Var13 + 1) + 0x48);
                local_228._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_228,lVar4,
                           *(long *)(*(long *)(p_Var13 + 1) + 0x50) + lVar4);
                __n = *(size_t *)(p_Var3 + 0x70);
                if (__n == local_228._M_string_length) {
                  if (__n == 0) {
                    bVar22 = true;
                  }
                  else {
                    iVar8 = bcmp(*(void **)(p_Var3 + 0x68),local_228._M_dataplus._M_p,__n);
                    bVar22 = iVar8 == 0;
                  }
                }
                else {
                  bVar22 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != paVar2) {
                  operator_delete(local_228._M_dataplus._M_p);
                }
                if (bVar22) {
                  ptVar11 = *(t_type **)(*pp_Var18 + 0x60);
                }
                pp_Var18 = pp_Var18 + 1;
              } while (pp_Var18 != (_func_int **)local_200[1].super_t_doc.doc_._M_dataplus._M_p);
            }
            this = local_208;
            if (ptVar11 == (t_type *)0x0) {
              __return_storage_ptr___00 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
              iVar8 = (*(local_200->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_1f0,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_02,iVar8));
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_1f0);
              local_228._M_dataplus._M_p = (pointer)*plVar15;
              psVar16 = (size_type *)(plVar15 + 2);
              if ((size_type *)local_228._M_dataplus._M_p == psVar16) {
                local_228.field_2._M_allocated_capacity = *psVar16;
                local_228.field_2._8_4_ = (undefined4)plVar15[3];
                local_228.field_2._12_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
                local_228._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_228.field_2._M_allocated_capacity = *psVar16;
              }
              local_228._M_string_length = plVar15[1];
              *plVar15 = (long)psVar16;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              lVar4 = *(long *)(*(long *)(p_Var13 + 1) + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,lVar4,*(long *)(*(long *)(p_Var13 + 1) + 0x50) + lVar4
                        );
              std::operator+(__return_storage_ptr___00,&local_228,&local_1c8);
              __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                          std::__cxx11::string::~string);
            }
            t_generator::indent((t_generator *)local_208,(ostream *)local_1a8);
            p_Var7 = local_1d0;
            render_const_value_abi_cxx11_
                      (&local_228,this,g_type_string,*(t_const_value **)(p_Var13 + 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != paVar2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
            render_const_value_abi_cxx11_
                      (&local_228,this,ptVar11,(t_const_value *)p_Var13[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != paVar2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            if (p_Var13 == p_Var7) break;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
      }
    }
    else {
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)local_1a8);
    }
    goto LAB_002abc36;
  }
  uVar10 = *(uint *)&ptVar11[1].super_t_doc._vptr_t_doc;
  switch(uVar10) {
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
    pcVar5 = (value->stringVal_)._M_dataplus._M_p;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar5,pcVar5 + (value->stringVal_)._M_string_length);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    goto LAB_002abc36;
  case 2:
    iVar14 = t_const_value::get_integer(value);
    pcVar19 = "false";
    if (0 < iVar14) {
      pcVar19 = "true";
    }
    uVar17 = (ulong)(0 < iVar14) ^ 5;
    break;
  case 3:
  case 4:
  case 5:
    goto switchD_002ab56b_caseD_3;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"lualongnumber.new(\'",0x13);
    t_const_value::get_integer(value);
    this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)local_1a8);
    uVar17 = 2;
    pcVar19 = "\')";
    break;
  case 7:
    tVar9 = t_const_value::get_type(value);
    if (tVar9 != CV_INTEGER) {
      std::ostream::_M_insert<double>(value->doubleVal_);
      goto LAB_002abc36;
    }
    goto switchD_002ab56b_caseD_3;
  default:
    auVar23 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_228,(t_base_type *)(ulong)uVar10,auVar23._8_4_);
    std::operator+(auVar23._0_8_,"compiler error: no const of base type ",&local_228);
    __cxa_throw(auVar23._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar19,uVar17);
LAB_002abc36:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_1f8;
switchD_002ab56b_caseD_3:
  t_const_value::get_integer(value);
  std::ostream::_M_insert<long>((long)local_1a8);
  goto LAB_002abc36;
}

Assistant:

string t_lua_generator::render_const_value(t_type* type, t_const_value* value) {
  std::ostringstream out;

  type = get_true_type(type);
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << "'" << value->get_string() << "'";
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_I64:
      out << "lualongnumber.new('" << value->get_integer() << "')";
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << type->get_name() << " = {" << endl;
    indent_up();

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }

      indent(out);
      out << render_const_value(g_type_string, v_iter->first);
      out << " = ";
      out << render_const_value(field_type, v_iter->second);
      ++v_iter;
      if (v_iter != val.end()) {
        out << ",";
      }
    }

    out << "}";
    indent_down();
  } else if (type->is_map()) {
    out << type->get_name() << "{" << endl;
    indent_up();

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      indent(out) << "[" << render_const_value(ktype, v_iter->first)
                  << "] = " << render_const_value(vtype, v_iter->second);
      ++v_iter;
      if (v_iter != val.end()) {
        out << ",";
      }
      out << endl;
    }
    indent_down();
    indent(out) << "}";
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    out << type->get_name() << " = {" << endl;
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      indent(out);
      out << "[" << render_const_value(etype, *v_iter) << "]";
      if (type->is_set()) {
        out << " = true";
      } else {
        out << " = false";
      }
      ++v_iter;
      if (v_iter != val.end()) {
        out << "," << endl;
      }
    }
    out << "}";
  }
  return out.str();
}